

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cc
# Opt level: O0

BIO * BIO_new_socket(int sock,int close_flag)

{
  BIO_METHOD *type;
  BIO *ret;
  int close_flag_local;
  int fd_local;
  
  type = BIO_s_socket();
  _close_flag_local = BIO_new(type);
  if (_close_flag_local == (BIO *)0x0) {
    _close_flag_local = (BIO *)0x0;
  }
  else {
    BIO_set_fd((BIO *)_close_flag_local,sock,close_flag);
  }
  return _close_flag_local;
}

Assistant:

BIO *BIO_new_socket(int fd, int close_flag) {
  BIO *ret;

  ret = BIO_new(BIO_s_socket());
  if (ret == NULL) {
    return NULL;
  }
  BIO_set_fd(ret, fd, close_flag);
  return ret;
}